

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfusableMatcher.cpp
# Opt level: O0

CMReturn * __thiscall
ConfusableMatcher::IndexOf
          (CMReturn *__return_storage_ptr__,ConfusableMatcher *this,string *In,string *Contains,
          CMOptions Options)

{
  CMOptions Options_00;
  uint64_t uVar1;
  long lVar2;
  ulong uVar3;
  CMReturn *ret;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  void *pvStack_48;
  CMStringView local_40;
  CMStringView local_30;
  string *local_20;
  string *Contains_local;
  string *In_local;
  ConfusableMatcher *this_local;
  
  local_20 = Contains;
  Contains_local = In;
  In_local = (string *)this;
  lVar2 = std::__cxx11::string::size();
  if (lVar2 == 0) {
    __return_storage_ptr__->Status = MATCH;
    __return_storage_ptr__->Start = 0;
    __return_storage_ptr__->Size = 0;
  }
  else {
    uVar1 = Options.StartIndex;
    uVar3 = std::__cxx11::string::size();
    if (uVar1 < uVar3) {
      std::experimental::fundamentals_v1::basic_string_view<char,std::char_traits<char>>::
      basic_string_view<std::allocator<char>>
                ((basic_string_view<char,std::char_traits<char>> *)&local_30,In);
      std::experimental::fundamentals_v1::basic_string_view<char,std::char_traits<char>>::
      basic_string_view<std::allocator<char>>
                ((basic_string_view<char,std::char_traits<char>> *)&local_40,Contains);
      memcpy(&local_70,&Options,0x30);
      Options_00.StartIndex = uStack_68;
      Options_00._0_8_ = local_70;
      Options_00._16_8_ = local_60;
      Options_00.TimeoutNs = uStack_58;
      Options_00._32_8_ = local_50;
      Options_00.ContainsPosPointers = pvStack_48;
      IndexOfFromView<(CMDebugLevel)0>
                (__return_storage_ptr__,this,local_30,local_40,Options_00,
                 (vector<_CMDebugFailure,_std::allocator<_CMDebugFailure>_> *)0x0);
    }
    else {
      __return_storage_ptr__->Status = NO_MATCH;
      __return_storage_ptr__->Start = 0;
      __return_storage_ptr__->Size = 0;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

CMReturn ConfusableMatcher::IndexOf(std::string In, std::string Contains, CMOptions Options)
{
	if (Contains.size() == 0) {
		CMReturn ret;

		ret.Status = MATCH;
		ret.Start = 0;
		ret.Size = 0;
		return ret;
	}

	if (Options.StartIndex >= In.size() || Options.StartIndex < 0) {
		CMReturn ret;
		ret.Status = NO_MATCH;
		ret.Start = 0;
		ret.Size = 0;
		return ret;
	}

	return IndexOfFromView<DEBUG_LEVEL_NONE>(CMStringView(In), CMStringView(Contains), Options, nullptr);
}